

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  undefined8 in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff10;
  string local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::__cxx11::string::string((string *)&local_d0,(string *)fmt_str);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff10,(string *)params);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,(string *)params_1);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffed0,(string *)params_2);
  ::std::__cxx11::string::string((string *)&local_50,(string *)params_3);
  ::std::__cxx11::string::string(local_70,(string *)params_4._M_dataplus._M_p);
  ::std::__cxx11::string::string(local_90,(string *)params_4._M_string_length);
  ::std::__cxx11::string::string(local_b0,(string *)params_4.field_2._M_allocated_capacity);
  params_4_00._M_string_length = (size_type)local_90;
  params_4_00._M_dataplus._M_p = (pointer)local_70;
  params_4_00.field_2._M_allocated_capacity = (size_type)local_b0;
  params_4_00.field_2._8_8_ = in_stack_fffffffffffffec8;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffed0,&local_50,params_4_00,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffef0,in_stack_ffffffffffffff10);
  ::std::__cxx11::string::~string(local_b0);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  ::std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}